

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_lash(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  CClass *this;
  char *pcVar5;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var6;
  OBJ_DATA *weapon;
  char buf [4608];
  int chance;
  CHAR_DATA *victim;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffdba8;
  CHAR_DATA *in_stack_ffffffffffffdbb0;
  CHAR_DATA *in_stack_ffffffffffffdbb8;
  char *in_stack_ffffffffffffdbc0;
  char_data *this_00;
  ulong uVar7;
  undefined4 in_stack_ffffffffffffdbd8;
  int in_stack_ffffffffffffdbdc;
  CHAR_DATA *in_stack_ffffffffffffdbe0;
  int in_stack_ffffffffffffdc84;
  undefined1 in_stack_ffffffffffffdc8b;
  int in_stack_ffffffffffffdc8c;
  CHAR_DATA *in_stack_ffffffffffffdc90;
  int in_stack_ffffffffffffdcac;
  CHAR_DATA *in_stack_ffffffffffffdcb0;
  int in_stack_ffffffffffffddd4;
  CHAR_DATA *in_stack_ffffffffffffddd8;
  CHAR_DATA *in_stack_ffffffffffffdde0;
  char *in_stack_ffffffffffffedb0;
  CHAR_DATA *in_stack_ffffffffffffedb8;
  int local_1224;
  CHAR_DATA *local_1220;
  char in_stack_ffffffffffffede8;
  undefined7 in_stack_ffffffffffffede9;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  
  one_argument((char *)in_stack_ffffffffffffdbb0,(char *)in_stack_ffffffffffffdba8);
  local_1224 = get_skill(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac);
  if (local_1224 == 0) {
    send_to_char(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
  }
  else {
    pOVar4 = get_eq_char(in_RDI,0x10);
    if ((pOVar4 == (OBJ_DATA *)0x0) || ((pOVar4->value[0] != 7 && (pOVar4->value[0] != 6)))) {
      local_1224 = local_1224 + -0xf;
      pOVar4 = get_eq_char(in_RDI,0x12);
    }
    if ((pOVar4 == (OBJ_DATA *)0x0) || ((pOVar4->value[0] != 7 && (pOVar4->value[0] != 6)))) {
      send_to_char(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
    }
    else if ((pOVar4->value[0] == 7) || (pOVar4->value[0] == 6)) {
      if (in_stack_ffffffffffffede8 == '\0') {
        local_1220 = in_RDI->fighting;
        if (local_1220 == (CHAR_DATA *)0x0) {
          send_to_char(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
          return;
        }
      }
      else {
        local_1220 = get_char_room(in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb0);
        if (local_1220 == (CHAR_DATA *)0x0) {
          send_to_char(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
          return;
        }
      }
      if (local_1220 == in_RDI) {
        send_to_char(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
      }
      else {
        bVar1 = is_safe(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
        if (!bVar1) {
          bVar1 = is_affected_by(in_stack_ffffffffffffdbb8,
                                 (int)((ulong)in_stack_ffffffffffffdbb0 >> 0x20));
          if ((bVar1) && (in_RDI->master == local_1220)) {
            act(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0,
                in_stack_ffffffffffffdba8,0);
          }
          else {
            uVar7 = in_RDI->off_flags[0];
            _Var6 = std::pow<int,int>(0,0x5eedb3);
            if (((uVar7 & (long)_Var6) != 0) ||
               (bVar1 = is_affected_by(in_stack_ffffffffffffdbb8,
                                       (int)((ulong)in_stack_ffffffffffffdbb0 >> 0x20)), bVar1)) {
              local_1224 = local_1224 + 5;
            }
            this_00 = (char_data *)local_1220->off_flags[0];
            _Var6 = std::pow<int,int>(0,0x5eee12);
            if ((((ulong)this_00 & (long)_Var6) != 0) ||
               (bVar1 = is_affected_by(in_stack_ffffffffffffdbb8,
                                       (int)((ulong)in_stack_ffffffffffffdbb0 >> 0x20)), bVar1)) {
              local_1224 = local_1224 + -0x23;
            }
            iVar2 = get_curr_stat(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbdc);
            iVar3 = get_curr_stat(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbdc);
            local_1224 = iVar2 * 2 + local_1224 + iVar3 * -2;
            bVar1 = is_affected_by(in_stack_ffffffffffffdbb8,
                                   (int)((ulong)in_stack_ffffffffffffdbb0 >> 0x20));
            if (bVar1) {
              local_1224 = local_1224 + -0x1e;
            }
            bVar1 = is_npc(in_stack_ffffffffffffdba8);
            if (!bVar1) {
              this = char_data::Class(this_00);
              iVar2 = CClass::GetIndex(this);
              if (iVar2 != 1) {
                local_1224 = local_1224 + -0x1e;
              }
            }
            bVar1 = is_npc(in_stack_ffffffffffffdba8);
            if (bVar1) {
              local_1224 = ((int)in_RDI->level - (int)local_1220->level) * 3 + local_1224;
            }
            bVar1 = is_npc(in_stack_ffffffffffffdba8);
            if (((!bVar1) && (bVar1 = is_npc(in_stack_ffffffffffffdba8), !bVar1)) &&
               ((local_1220->fighting == (CHAR_DATA *)0x0 || (in_RDI->fighting == (CHAR_DATA *)0x0))
               )) {
              in_stack_ffffffffffffdbb8 = (CHAR_DATA *)&stack0xffffffffffffdbd8;
              pcVar5 = pers(in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0);
              sprintf((char *)in_stack_ffffffffffffdbb8,"Help! %s is lashing me!",pcVar5);
              do_myell(this_00,(char *)in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0);
            }
            iVar2 = number_percent();
            if (local_1224 < iVar2) {
              act((char *)this_00,in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0,
                  in_stack_ffffffffffffdba8,0);
              act((char *)this_00,in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0,
                  in_stack_ffffffffffffdba8,0);
              act((char *)this_00,in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0,
                  in_stack_ffffffffffffdba8,0);
              iVar2 = (int)((ulong)in_stack_ffffffffffffdbb8 >> 0x20);
              check_improve(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,
                            (bool)in_stack_ffffffffffffdc8b,in_stack_ffffffffffffdc84);
              if (in_RDI->fighting == (CHAR_DATA *)0x0) {
                set_fighting(in_stack_ffffffffffffedf0,
                             (CHAR_DATA *)
                             CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
              }
              WAIT_STATE(this_00,iVar2);
            }
            else {
              act((char *)this_00,in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0,
                  in_stack_ffffffffffffdba8,0);
              act((char *)this_00,in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0,
                  in_stack_ffffffffffffdba8,0);
              act((char *)this_00,in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0,
                  in_stack_ffffffffffffdba8,0);
              iVar3 = (int)((ulong)in_stack_ffffffffffffdbb8 >> 0x20);
              iVar2 = (int)((ulong)in_stack_ffffffffffffdba8 >> 0x20);
              check_improve(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,
                            (bool)in_stack_ffffffffffffdc8b,in_stack_ffffffffffffdc84);
              LAG_CHAR(in_stack_ffffffffffffdbb0,iVar2);
              WAIT_STATE(this_00,iVar3);
              dice((int)local_1220,(int)((ulong)in_RDI >> 0x20));
              damage_old(in_stack_ffffffffffffdbe0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
                         (int)((ulong)pOVar4 >> 0x20),(int)pOVar4,(int)(uVar7 >> 0x20),
                         SUB81(uVar7 >> 0x18,0));
              if (in_RDI->fighting == (CHAR_DATA *)0x0) {
                multi_hit(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8,
                          in_stack_ffffffffffffddd4);
              }
              local_1220->position = 5;
            }
          }
        }
      }
    }
    else {
      send_to_char(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
    }
  }
  return;
}

Assistant:

void do_lash(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	int chance;
	char buf[MAX_STRING_LENGTH];
	OBJ_DATA *weapon;

	one_argument(argument, arg);

	chance = get_skill(ch, gsn_lash);

	if (chance == 0)
	{
		send_to_char("You don't have the skill to lash people's legs.\n\r", ch);
		return;
	}

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon == nullptr || (weapon->value[0] != WEAPON_WHIP && weapon->value[0] != WEAPON_FLAIL))
	{
		chance -= 15;
		weapon = get_eq_char(ch, WEAR_DUAL_WIELD);
	}

	if (weapon == nullptr || (weapon->value[0] != WEAPON_WHIP && weapon->value[0] != WEAPON_FLAIL))
	{
		send_to_char("You aren't wielding any weapon to lash with.\n\r", ch);
		return;
	}

	if (weapon->value[0] != WEAPON_WHIP && weapon->value[0] != WEAPON_FLAIL)
	{
		send_to_char("You need to be wielding a whip or flail to lash.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		victim = ch->fighting;

		if (victim == nullptr)
		{
			send_to_char("But you aren't fighting anyone!\n\r", ch);
			return;
		}
	}
	else
	{
		victim = get_char_room(ch, arg);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}
	}

	if (victim == ch)
	{
		send_to_char("You try to lash your feet and look clumsy doing it.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
	{
		act("But $N is your friend!", ch, nullptr, victim, TO_CHAR);
		return;
	}

	/* speed */
	if (IS_SET(ch->off_flags, OFF_FAST) || is_affected_by(ch, AFF_HASTE))
		chance += 5;

	if (IS_SET(victim->off_flags, OFF_FAST) || is_affected_by(victim, AFF_HASTE))
		chance -= 35;

	chance += get_curr_stat(ch, STAT_DEX) * 2;
	chance -= get_curr_stat(victim, STAT_DEX) * 2;

	if (is_affected_by(victim, AFF_FLYING))
		chance -= 30;

	if (!is_npc(ch) && ch->Class()->GetIndex() != CLASS_WARRIOR)
		chance -= 30;

	/* level */
	if (is_npc(victim))
		chance += (ch->level - victim->level) * 3;

	if (!is_npc(ch) && !is_npc(victim) && (victim->fighting == nullptr || ch->fighting == nullptr))
	{
		sprintf(buf, "Help! %s is lashing me!", pers(ch, victim));
		do_myell(victim, buf, ch);
	}

	if (number_percent() > chance)
	{
		act("$n lashes at $N's legs but misses.", ch, 0, victim, TO_NOTVICT);
		act("$n lashes at your legs but misses.", ch, 0, victim, TO_VICT);
		act("You lash at $N's legs but miss.", ch, 0, victim, TO_CHAR);
		check_improve(ch, gsn_lash, false, 1);

		if (ch->fighting == nullptr)
			set_fighting(ch, victim);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	act("$n lashes $N's legs, sending $M crashing down.", ch, 0, victim, TO_NOTVICT);
	act("$n lashes your legs, sending you crashing to the ground.", ch, 0, victim, TO_VICT);
	act("You lash $N's legs, sending $M crashing to the ground.", ch, 0, victim, TO_CHAR);
	check_improve(ch, gsn_lash, true, 1);

	LAG_CHAR(victim, (int)(PULSE_VIOLENCE * 1.5));
	WAIT_STATE(ch, PULSE_VIOLENCE * 2);

	damage_old(ch, victim, dice(2, 7), gsn_lash, DAM_BASH, true);

	if (ch->fighting == nullptr)
		multi_hit(victim, ch, TYPE_UNDEFINED);

	victim->position = POS_RESTING;
}